

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::FloatDotsTexture::ToString_abi_cxx11_(FloatDotsTexture *this)

{
  string *in_RDI;
  FloatTextureHandle *in_stack_00000010;
  FloatTextureHandle *in_stack_00000018;
  TextureMapping2DHandle *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string FloatDotsTexture::ToString() const {
    return StringPrintf("[ FloatDotsTexture mapping: %s insideDot: %s outsideDot: %s ]",
                        mapping, insideDot, outsideDot);
}